

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor_test.cc
# Opt level: O1

void __thiscall
should_try_get_fields_after_parsing::Visitor::operator()(Visitor *this,Ref *header,Ref *logon)

{
  size_type *psVar1;
  void *pvVar2;
  bool bVar3;
  bool bVar4;
  ulong uVar5;
  VersionnedMessageRef<Fixpp::v42::Version,_Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
  *message;
  char *pcVar6;
  char *in_R9;
  undefined1 local_d00 [8];
  Values msgTypes;
  string senderCompId;
  string refMsgType;
  undefined1 local_70 [8];
  AssertionResult gtest_ar_2;
  char local_49;
  undefined1 uStack_48;
  undefined7 uStack_47;
  char msgDirection;
  AssertionResult gtest_ar__1;
  
  senderCompId._M_dataplus._M_p = (pointer)0x0;
  senderCompId._M_string_length._0_1_ = 0;
  msgTypes.Storage.InlineElts[8].super_AlignedCharArray<8UL,_312UL>.buffer._304_8_ =
       &senderCompId._M_string_length;
  bVar3 = Fixpp::
          tryGet<Fixpp::TagT<49u,Fixpp::Type::String>,Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<>,Fixpp::Required<Fixpp::TagT<49u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<56u,Fixpp::Type::String>>,Fixpp::TagT<115u,Fixpp::Type::String>,Fixpp::TagT<128u,Fixpp::Type::String>,Fixpp::TagT<90u,Fixpp::Type::Int>,Fixpp::TagT<91u,Fixpp::Type::Data>,Fixpp::Required<Fixpp::TagT<34u,Fixpp::Type::Int>>,Fixpp::TagT<50u,Fixpp::Type::String>,Fixpp::TagT<142u,Fixpp::Type::String>,Fixpp::TagT<57u,Fixpp::Type::String>,Fixpp::TagT<143u,Fixpp::Type::String>,Fixpp::TagT<116u,Fixpp::Type::String>,Fixpp::TagT<144u,Fixpp::Type::String>,Fixpp::TagT<129u,Fixpp::Type::String>,Fixpp::TagT<145u,Fixpp::Type::String>,Fixpp::TagT<43u,Fixpp::Type::Boolean>,Fixpp::TagT<97u,Fixpp::Type::Boolean>,Fixpp::Required<Fixpp::TagT<52u,Fixpp::Type::UTCTimestamp>>,Fixpp::TagT<122u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<212u,Fixpp::Type::Int>,Fixpp::TagT<213u,Fixpp::Type::Data>,Fixpp::TagT<347u,Fixpp::Type::String>,Fixpp::TagT<369u,Fixpp::Type::Int>,Fixpp::TagT<370u,Fixpp::Type::UTCTimestamp>>>
                    (header,(UnderlyingType *)
                            (msgTypes.Storage.InlineElts[8].super_AlignedCharArray<8UL,_312UL>.
                             buffer + 0x130));
  senderCompId.field_2._M_local_buf[8] = bVar3;
  refMsgType._M_dataplus._M_p = (pointer)0x0;
  if (bVar3) {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&refMsgType,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::Message::Message((Message *)local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_d00,(internal *)(senderCompId.field_2._M_local_buf + 8),
               (AssertionResult *)"Fixpp::tryGet<Fixpp::Tag::SenderCompID>(header, senderCompId)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffb8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/visitor_test.cc"
               ,0x4a,(char *)CONCAT71(local_d00._1_7_,local_d00[0]));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffffb8,(Message *)local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb8);
    if ((void **)CONCAT71(local_d00._1_7_,local_d00[0]) !=
        &msgTypes.
         super_SmallVectorImpl<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>_>
         .
         super_SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_false>
         .
         super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_void>
         .super_SmallVectorBase.EndX) {
      operator_delete((undefined1 *)CONCAT71(local_d00._1_7_,local_d00[0]),
                      (long)msgTypes.
                            super_SmallVectorImpl<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>_>
                            .
                            super_SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_false>
                            .
                            super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_void>
                            .super_SmallVectorBase.EndX + 1);
    }
    if (local_70 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_70 != (undefined1  [8])0x0)) {
        (**(code **)(*(long *)local_70 + 8))();
      }
      local_70 = (undefined1  [8])0x0;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&refMsgType,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (!bVar3) goto LAB_009fb75a;
  }
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[4]>
            ((internal *)local_d00,"senderCompId","\"ABC\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (msgTypes.Storage.InlineElts[8].super_AlignedCharArray<8UL,_312UL>.buffer + 0x130),
             (char (*) [4])0xa68c3b);
  if (local_d00[0] == (internal)0x0) {
    testing::Message::Message((Message *)((long)&senderCompId.field_2 + 8));
    if (msgTypes.
        super_SmallVectorImpl<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>_>
        .
        super_SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_false>
        .
        super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_void>
        .super_SmallVectorBase.BeginX == (void *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *msgTypes.
                super_SmallVectorImpl<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>_>
                .
                super_SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_false>
                .
                super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_void>
                .super_SmallVectorBase.BeginX;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_70,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/visitor_test.cc"
               ,0x4b,pcVar6);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)local_70,(Message *)((long)&senderCompId.field_2 + 8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_70);
    if (senderCompId.field_2._8_8_ != 0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (senderCompId.field_2._8_8_ != 0)) {
        (**(code **)(*(long *)senderCompId.field_2._8_8_ + 8))();
      }
      senderCompId.field_2._8_8_ = 0;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&msgTypes,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    goto LAB_009fb75a;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&msgTypes,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  Fixpp::
  get<Fixpp::TagT<384u,Fixpp::Type::Int>,Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)65>,Fixpp::Required<Fixpp::TagT<98u,Fixpp::Type::Int>>,Fixpp::Required<Fixpp::TagT<108u,Fixpp::Type::Int>>,Fixpp::TagT<95u,Fixpp::Type::Int>,Fixpp::TagT<96u,Fixpp::Type::Data>,Fixpp::TagT<141u,Fixpp::Type::Boolean>,Fixpp::TagT<383u,Fixpp::Type::Int>,Fixpp::SmallRepeatingGroup<Fixpp::TagT<384u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<372u,Fixpp::Type::String>,Fixpp::TagT<385u,Fixpp::Type::Char>>>>
            ((Values *)local_d00,(Fixpp *)logon,message);
  local_70 = (undefined1  [8])
             (((long)msgTypes.
                     super_SmallVectorImpl<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>_>
                     .
                     super_SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_false>
                     .
                     super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_void>
                     .super_SmallVectorBase.BeginX - CONCAT71(local_d00._1_7_,local_d00[0]) >> 3) *
             0x6f96f96f96f96f97);
  _uStack_48 = 2;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)(senderCompId.field_2._M_local_buf + 8),"msgTypes.size()","2",
             (unsigned_long *)local_70,(int *)&stack0xffffffffffffffb8);
  if (senderCompId.field_2._M_local_buf[8] == '\0') {
    testing::Message::Message((Message *)local_70);
    if (refMsgType._M_dataplus._M_p == (pointer)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)refMsgType._M_dataplus._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffb8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/visitor_test.cc"
               ,0x4e,pcVar6);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffffb8,(Message *)local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb8);
    if (local_70 != (undefined1  [8])0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_70 != (undefined1  [8])0x0)) {
        (**(code **)(*(long *)local_70 + 8))();
      }
      local_70 = (undefined1  [8])0x0;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&refMsgType,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&refMsgType,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    psVar1 = &refMsgType._M_string_length;
    refMsgType._M_dataplus._M_p = (pointer)0x0;
    refMsgType._M_string_length._0_1_ = 0;
    senderCompId.field_2._8_8_ = psVar1;
    if ((InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
         *)msgTypes.
           super_SmallVectorImpl<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>_>
           .
           super_SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_false>
           .
           super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_void>
           .super_SmallVectorBase.BeginX ==
        (InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
         *)CONCAT71(local_d00._1_7_,local_d00[0])) goto LAB_009fb787;
    bVar3 = Fixpp::
            tryGet<Fixpp::TagT<372u,Fixpp::Type::String>,Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<372u,Fixpp::Type::String>,Fixpp::TagT<385u,Fixpp::Type::Char>>>>
                      ((InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                        *)CONCAT71(local_d00._1_7_,local_d00[0]),
                       (UnderlyingType *)((long)&senderCompId.field_2 + 8));
    uStack_48 = bVar3;
    gtest_ar__1.success_ = false;
    gtest_ar__1._1_7_ = 0;
    if (bVar3) {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar__1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
           );
LAB_009fb267:
      testing::internal::CmpHelperEQ<std::__cxx11::string,char[5]>
                ((internal *)local_70,"refMsgType","\"TEST\"",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&senderCompId.field_2 + 8),(char (*) [5])"TEST");
      if (local_70[0] == (internal)0x0) {
        testing::Message::Message((Message *)&stack0xffffffffffffffb8);
        if (gtest_ar_2._0_8_ == 0) {
          pcVar6 = "";
        }
        else {
          pcVar6 = *(char **)gtest_ar_2._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar__1.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/visitor_test.cc"
                   ,0x54,pcVar6);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar__1.message_,(Message *)&stack0xffffffffffffffb8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
        if (_uStack_48 != (AssertHelperData *)0x0) {
          bVar3 = testing::internal::IsTrue(true);
          if ((bVar3) && (_uStack_48 != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)_uStack_48 + 8))();
          }
          _uStack_48 = (AssertHelperData *)0x0;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar_2,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar_2,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        pvVar2 = (void *)CONCAT71(local_d00._1_7_,local_d00[0]);
        if (msgTypes.
            super_SmallVectorImpl<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>_>
            .
            super_SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_false>
            .
            super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_void>
            .super_SmallVectorBase.BeginX == pvVar2) {
LAB_009fb787:
          __assert_fail("idx < size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/include/fixpp/utils/SmallVector.h"
                        ,0x182,
                        "reference llvm::SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384, Fixpp::Type::Int>, Fixpp::SizeHint<10>, Fixpp::TagT<372, Fixpp::Type::String>, Fixpp::TagT<385, Fixpp::Type::Char>>>>::operator[](size_type) [T = Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384, Fixpp::Type::Int>, Fixpp::SizeHint<10>, Fixpp::TagT<372, Fixpp::Type::String>, Fixpp::TagT<385, Fixpp::Type::Char>>>]"
                       );
        }
        uVar5 = *(ulong *)((long)pvVar2 + 0x28) & 2;
        if (uVar5 != 0) {
          if (*(char **)((long)pvVar2 + 0x10) == (char *)0x0) {
            local_49 = '\0';
          }
          else {
            local_49 = **(char **)((long)pvVar2 + 0x10);
          }
        }
        uStack_48 = (char)(uVar5 >> 1);
        gtest_ar__1.success_ = false;
        gtest_ar__1._1_7_ = 0;
        if (uVar5 == 0) {
          testing::Message::Message((Message *)&gtest_ar__1.message_);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_70,(internal *)&stack0xffffffffffffffb8,
                     (AssertionResult *)
                     "Fixpp::tryGet<Fixpp::Tag::MsgDirection>(msgTypes[0], msgDirection)","false",
                     "true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)((long)&refMsgType.field_2 + 8),kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/visitor_test.cc"
                     ,0x56,(char *)local_70);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)((long)&refMsgType.field_2 + 8),
                     (Message *)&gtest_ar__1.message_);
          testing::internal::AssertHelper::~AssertHelper
                    ((AssertHelper *)((long)&refMsgType.field_2 + 8));
          if (local_70 != (undefined1  [8])&gtest_ar_2.message_) {
            operator_delete((void *)local_70,
                            (ulong)((long)&((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p + 1));
          }
          if (gtest_ar__1.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar3 = testing::internal::IsTrue(true);
            if ((bVar3) &&
               (gtest_ar__1.message_.ptr_ !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(((gtest_ar__1.message_.ptr_)->_M_dataplus)._M_p + 8))();
            }
            gtest_ar__1.message_.ptr_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar__1,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        }
        else {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar__1,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          uStack_48 = 0x43;
          testing::internal::CmpHelperEQ<char,char>
                    ((internal *)local_70,"msgDirection","\'C\'",&local_49,&stack0xffffffffffffffb8)
          ;
          if (local_70[0] == (internal)0x0) {
            testing::Message::Message((Message *)&stack0xffffffffffffffb8);
            if (gtest_ar_2._0_8_ == 0) {
              pcVar6 = "";
            }
            else {
              pcVar6 = *(char **)gtest_ar_2._0_8_;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar__1.message_,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/visitor_test.cc"
                       ,0x57,pcVar6);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar__1.message_,(Message *)&stack0xffffffffffffffb8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
            if (_uStack_48 != (AssertHelperData *)0x0) {
              bVar3 = testing::internal::IsTrue(true);
              if ((bVar3) && (_uStack_48 != (AssertHelperData *)0x0)) {
                (**(code **)(*(long *)_uStack_48 + 8))();
              }
              _uStack_48 = (AssertHelperData *)0x0;
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_2,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          }
          else {
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_2,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            if ((ulong)(((long)msgTypes.
                               super_SmallVectorImpl<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>_>
                               .
                               super_SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_false>
                               .
                               super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_void>
                               .super_SmallVectorBase.BeginX -
                         CONCAT71(local_d00._1_7_,local_d00[0]) >> 3) * 0x6f96f96f96f96f97) < 2)
            goto LAB_009fb787;
            bVar3 = Fixpp::
                    tryGet<Fixpp::TagT<372u,Fixpp::Type::String>,Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<372u,Fixpp::Type::String>,Fixpp::TagT<385u,Fixpp::Type::Char>>>>
                              ((InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                                *)(CONCAT71(local_d00._1_7_,local_d00[0]) + 0x138),
                               (UnderlyingType *)((long)&senderCompId.field_2 + 8));
            uStack_48 = bVar3;
            gtest_ar__1.success_ = false;
            gtest_ar__1._1_7_ = 0;
            if (bVar3) {
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar__1,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            }
            else {
              testing::Message::Message((Message *)&gtest_ar__1.message_);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_70,(internal *)&stack0xffffffffffffffb8,
                         (AssertionResult *)
                         "Fixpp::tryGet<Fixpp::Tag::RefMsgType>(msgTypes[1], refMsgType)","false",
                         "true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)((long)&refMsgType.field_2 + 8),kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/visitor_test.cc"
                         ,0x59,(char *)local_70);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)((long)&refMsgType.field_2 + 8),
                         (Message *)&gtest_ar__1.message_);
              testing::internal::AssertHelper::~AssertHelper
                        ((AssertHelper *)((long)&refMsgType.field_2 + 8));
              if (local_70 != (undefined1  [8])&gtest_ar_2.message_) {
                operator_delete((void *)local_70,
                                (ulong)((long)&((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p + 1));
              }
              if (gtest_ar__1.message_.ptr_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                bVar4 = testing::internal::IsTrue(true);
                if ((bVar4) &&
                   (gtest_ar__1.message_.ptr_ !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
                  (**(code **)(((gtest_ar__1.message_.ptr_)->_M_dataplus)._M_p + 8))();
                }
                gtest_ar__1.message_.ptr_ =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar__1,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
              if (!bVar3) goto LAB_009fb736;
            }
            testing::internal::CmpHelperEQ<std::__cxx11::string,char[5]>
                      ((internal *)local_70,"refMsgType","\"TEST\"",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&senderCompId.field_2 + 8),(char (*) [5])"TEST");
            if (local_70[0] == (internal)0x0) {
              testing::Message::Message((Message *)&stack0xffffffffffffffb8);
              if (gtest_ar_2._0_8_ == 0) {
                pcVar6 = "";
              }
              else {
                pcVar6 = *(char **)gtest_ar_2._0_8_;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar__1.message_,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/visitor_test.cc"
                         ,0x5a,pcVar6);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar__1.message_,(Message *)&stack0xffffffffffffffb8);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
              if (_uStack_48 != (AssertHelperData *)0x0) {
                bVar3 = testing::internal::IsTrue(true);
                if ((bVar3) && (_uStack_48 != (AssertHelperData *)0x0)) {
                  (**(code **)(*(long *)_uStack_48 + 8))();
                }
                _uStack_48 = (AssertHelperData *)0x0;
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_2,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          }
        }
      }
    }
    else {
      testing::Message::Message((Message *)&gtest_ar__1.message_);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_70,(internal *)&stack0xffffffffffffffb8,
                 (AssertionResult *)"Fixpp::tryGet<Fixpp::Tag::RefMsgType>(msgTypes[0], refMsgType)"
                 ,"false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)((long)&refMsgType.field_2 + 8),kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/visitor_test.cc"
                 ,0x53,(char *)local_70);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)((long)&refMsgType.field_2 + 8),(Message *)&gtest_ar__1.message_);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)((long)&refMsgType.field_2 + 8));
      if (local_70 != (undefined1  [8])&gtest_ar_2.message_) {
        operator_delete((void *)local_70,
                        (ulong)((long)&((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p + 1));
      }
      if (gtest_ar__1.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) &&
           (gtest_ar__1.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(((gtest_ar__1.message_.ptr_)->_M_dataplus)._M_p + 8))();
        }
        gtest_ar__1.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar__1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
           );
      if (bVar3) goto LAB_009fb267;
    }
LAB_009fb736:
    if ((size_type *)senderCompId.field_2._8_8_ != psVar1) {
      operator_delete((void *)senderCompId.field_2._8_8_,
                      CONCAT71(refMsgType._M_string_length._1_7_,
                               (undefined1)refMsgType._M_string_length) + 1);
    }
  }
  llvm::
  SmallVectorImpl<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>_>
  ::~SmallVectorImpl((SmallVectorImpl<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>_>
                      *)local_d00);
LAB_009fb75a:
  if ((size_type *)msgTypes.Storage.InlineElts[8].super_AlignedCharArray<8UL,_312UL>.buffer._304_8_
      != &senderCompId._M_string_length) {
    operator_delete((void *)msgTypes.Storage.InlineElts[8].super_AlignedCharArray<8UL,_312UL>.buffer
                            ._304_8_,
                    CONCAT71(senderCompId._M_string_length._1_7_,
                             (undefined1)senderCompId._M_string_length) + 1);
  }
  return;
}

Assistant:

void operator()(const Fixpp::v42::Header::Ref& header, const Fixpp::v42::Message::Logon::Ref& logon)
        {
            std::string senderCompId;
            ASSERT_TRUE(Fixpp::tryGet<Fixpp::Tag::SenderCompID>(header, senderCompId));
            ASSERT_EQ(senderCompId, "ABC");

            auto msgTypes = Fixpp::get<Fixpp::Tag::NoMsgTypes>(logon);
            ASSERT_EQ(msgTypes.size(), 2);

            std::string refMsgType;
            char msgDirection;

            ASSERT_TRUE(Fixpp::tryGet<Fixpp::Tag::RefMsgType>(msgTypes[0], refMsgType));
            ASSERT_EQ(refMsgType, "TEST");

            ASSERT_TRUE(Fixpp::tryGet<Fixpp::Tag::MsgDirection>(msgTypes[0], msgDirection));
            ASSERT_EQ(msgDirection, 'C');

            ASSERT_TRUE(Fixpp::tryGet<Fixpp::Tag::RefMsgType>(msgTypes[1], refMsgType));
            ASSERT_EQ(refMsgType, "TEST");
        }